

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O3

TestStatus *
vkt::wsi::anon_unknown_0::basicRenderTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  InstanceDriver *vki;
  BinaryCollection *binaryRegistry;
  VkSurfaceKHR VVar1;
  Window *pWVar2;
  TestStatus *pTVar3;
  VkDevice device;
  VkResult VVar4;
  TestError *this;
  size_t numCommandBuffers;
  ulong uVar5;
  deUint32 imageNdx;
  VkFence imageReadyFence;
  VkPipelineStageFlags waitDstStage;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  swapchainImages;
  VkSemaphore imageReadySemaphore;
  VkCommandBuffer commandBuffer;
  VkSemaphore renderingCompleteSemaphore;
  UVec2 desiredSize;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  commandBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  renderingCompleteSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  imageReadySemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  imageReadyFences;
  VkPresentInfoKHR presentInfo;
  VkSubmitInfo submitInfo;
  VkSwapchainCreateInfoKHR swapchainInfo;
  InstanceHelper instHelper;
  TriangleRenderer renderer;
  SimpleAllocator allocator;
  deUint32 desiredImageCount;
  uint local_dfc;
  Context *local_df8;
  deUint64 local_df0;
  undefined4 local_de4;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> local_de0;
  VkSurfaceKHR local_dc8;
  undefined1 local_dc0 [32];
  VkAllocationCallbacks *pVStack_da0;
  Window *local_d98;
  TestStatus *local_d90;
  Display *local_d88;
  ulong local_d80;
  VkCommandBuffer local_d78;
  deUint64 local_d70;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> local_d68;
  UVec2 local_d50;
  deUint64 local_d48;
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_d40;
  VkDevice local_d38;
  VkAllocationCallbacks *pVStack_d30;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  local_d28;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_d10;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  local_cf8;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  local_ce0;
  VkExtent2D local_cc8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_cc0;
  Enum<vk::VkResult,_4UL> local_ca8;
  undefined4 local_c98;
  deUint64 *local_c90;
  undefined4 local_c88;
  undefined1 *local_c80;
  uint *local_c78;
  undefined8 local_c70;
  NativeObjects local_c68;
  undefined1 local_c48 [8];
  DeviceInterface *pDStack_c40;
  deUint32 local_c38;
  VkMemoryPropertyFlags VStack_c34;
  VkAllocationCallbacks *pVStack_c30;
  undefined4 *local_c28;
  deUint32 local_c20;
  VkCommandBuffer *local_c18;
  deUint32 local_c10;
  deUint64 *local_c08;
  ios_base local_bd0 [400];
  VkSwapchainCreateInfoKHR local_a40;
  InstanceHelper local_9d8;
  undefined1 local_820 [8];
  anon_union_8_2_d0736028_for_Maybe<tcu::Vector<unsigned_int,_2>_>_2 aStack_818;
  VkDevice local_810;
  VkAllocationCallbacks *pVStack_808;
  VkAllocationCallbacks *local_800;
  DeviceDriver local_7f8;
  VkQueue local_340;
  TriangleRenderer local_338;
  SimpleAllocator local_250;
  
  local_d50.m_data[0] = 0x100;
  local_d50.m_data[1] = 0x100;
  InstanceHelper::InstanceHelper(&local_9d8,context,wsiType,(VkAllocationCallbacks *)0x0);
  local_820 = (undefined1  [8])&aStack_818;
  aStack_818.m_align = 0x10000000100;
  local_df8 = context;
  NativeObjects::NativeObjects
            (&local_c68,(Context *)context->m_testCtx->m_platform,&local_9d8.supportedExtensions,
             wsiType,(Maybe<tcu::Vector<unsigned_int,_2>_> *)local_820);
  vki = &local_9d8.vki;
  desiredImageCount = 0;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)local_820,&vki->super_InstanceInterface,
             local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             local_c68.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             local_c68.window.
             super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr,
             (VkAllocationCallbacks *)0x0);
  local_d88 = local_c68.display.
              super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr;
  local_d38 = local_810;
  pVStack_d30 = pVStack_808;
  local_d48 = (deUint64)local_820;
  aStack_d40.m_data = aStack_818.m_data;
  local_dc8.m_internal = (deUint64)local_820;
  DeviceHelper::DeviceHelper
            ((DeviceHelper *)local_820,(Context *)local_df8->m_testCtx->m_cmdLine,
             &vki->super_InstanceInterface,
             local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_820,(VkAllocationCallbacks *)0x0);
  device = local_810;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)local_c48,&vki->super_InstanceInterface,
             (VkPhysicalDevice)local_820);
  ::vk::SimpleAllocator::SimpleAllocator
            (&local_250,&local_7f8.super_DeviceInterface,device,
             (VkPhysicalDeviceMemoryProperties *)local_c48);
  getBasicSwapchainParameters
            (&local_a40,wsiType,&vki->super_InstanceInterface,(VkPhysicalDevice)local_820,local_dc8,
             &local_d50,desiredImageCount);
  ::vk::createSwapchainKHR
            ((Move<vk::Handle<(vk::HandleType)26>_> *)local_c48,&local_7f8.super_DeviceInterface,
             device,&local_a40,(VkAllocationCallbacks *)0x0);
  pVStack_da0 = pVStack_c30;
  local_dc0._8_8_ = local_c48;
  local_dc0._16_8_ = pDStack_c40;
  ::vk::wsi::getSwapchainImages
            (&local_de0,&local_7f8.super_DeviceInterface,device,(VkSwapchainKHR)local_c48);
  binaryRegistry = local_df8->m_progCollection;
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(&local_d68,&local_de0);
  local_c48._0_4_ = local_a40.imageExtent.width;
  local_c48._4_4_ = local_a40.imageExtent.height;
  TriangleRenderer::TriangleRenderer
            (&local_338,&local_7f8.super_DeviceInterface,device,&local_250.super_Allocator,
             binaryRegistry,&local_d68,local_a40.imageFormat,(UVec2 *)local_c48);
  if (local_d68.
      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d68.
                    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d68.
                          super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d68.
                          super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  numCommandBuffers = 0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_c48,&local_7f8.super_DeviceInterface,
             device,2,aStack_818.m_align._0_4_,(VkAllocationCallbacks *)0x0);
  DStack_cc0.m_allocator = pVStack_c30;
  local_cc8.width = local_c48._0_4_;
  local_cc8.height = local_c48._4_4_;
  DStack_cc0.m_deviceIface = pDStack_c40;
  uVar5 = (long)local_de0.
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_de0.
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 2;
  createFences(&local_ce0,&local_7f8.super_DeviceInterface,device,uVar5);
  createSemaphores(&local_cf8,&local_7f8.super_DeviceInterface,device,uVar5 | 1);
  createSemaphores(&local_d10,&local_7f8.super_DeviceInterface,device,uVar5);
  local_d98 = local_c68.window.
              super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.m_data.ptr;
  local_d90 = __return_storage_ptr__;
  local_d80 = uVar5;
  allocateCommandBuffers
            (&local_d28,&local_7f8.super_DeviceInterface,device,(VkCommandPool)local_cc8,
             (VkCommandBufferLevel)uVar5,numCommandBuffers);
  uVar5 = 0;
  while( true ) {
    local_df0 = ((local_ce0.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [uVar5 % (ulong)((long)local_ce0.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_ce0.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
    local_dc0._0_8_ =
         ((local_cf8.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [uVar5 % (ulong)((long)local_cf8.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_cf8.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
    local_dfc = 0xffffffff;
    if (local_d80 <= uVar5) {
      VVar4 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[0x16])
                        (&local_7f8,device,1,&local_df0,1,0xffffffffffffffff);
      ::vk::checkResult(VVar4,
                        "vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x563);
    }
    VVar4 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[0x14])
                      (&local_7f8,device,1,&local_df0);
    ::vk::checkResult(VVar4,"vkd.resetFences(device, 1, &imageReadyFence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x565);
    VVar4 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[0x7b])
                      (&local_7f8,device,local_dc0._8_8_,0xffffffffffffffff,local_dc0._0_8_,
                       local_df0,&local_dfc);
    if (VVar4 == VK_SUBOPTIMAL_KHR) {
      local_c48 = (undefined1  [8])local_df8->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pDStack_c40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pDStack_c40,"Got ",4);
      local_ca8.m_getName = ::vk::getResultName;
      local_ca8.m_value = VK_SUBOPTIMAL_KHR;
      tcu::Format::Enum<vk::VkResult,_4UL>::toStream(&local_ca8,(ostream *)&pDStack_c40);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pDStack_c40," at frame ",10);
      std::ostream::_M_insert<unsigned_long>((ulong)&pDStack_c40);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_c48,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pDStack_c40);
      std::ios_base::~ios_base(local_bd0);
    }
    else {
      ::vk::checkResult(VVar4,"acquireResult",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x572);
    }
    if ((ulong)((long)local_de0.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_de0.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)local_dfc) break;
    local_d70 = ((local_d10.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [uVar5 % (ulong)((long)local_d10.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_d10.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
    local_d78 = ((local_d28.
                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [uVar5 % (ulong)((long)local_d28.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_d28.
                                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
                super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
    local_de4 = 0x400;
    local_c48._0_4_ = 4;
    pDStack_c40 = (DeviceInterface *)0x0;
    local_c38 = 1;
    pVStack_c30 = (VkAllocationCallbacks *)local_dc0;
    local_c28 = &local_de4;
    local_c20 = 1;
    local_c18 = &local_d78;
    local_c10 = 1;
    local_c90 = &local_d70;
    local_ca8.m_getName = (GetNameFunc)CONCAT44(local_ca8.m_getName._4_4_,0x3b9acde9);
    local_ca8.m_value = VK_SUCCESS;
    local_ca8._12_4_ = 0;
    local_c98 = 1;
    local_c88 = 1;
    local_c80 = local_dc0 + 8;
    local_c78 = &local_dfc;
    local_c70 = 0;
    local_c08 = local_c90;
    TriangleRenderer::recordFrame(&local_338,local_d78,local_dfc,(deUint32)uVar5);
    VVar4 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[2])
                      (&local_7f8,local_340,1,local_c48,0);
    ::vk::checkResult(VVar4,"vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x594);
    VVar4 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[0x7c])
                      (&local_7f8,local_340,&local_ca8);
    ::vk::checkResult(VVar4,"vkd.queuePresentKHR(devHelper.queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x595);
    uVar5 = uVar5 + 1;
    if (uVar5 == 600) {
      VVar4 = (*local_7f8.super_DeviceInterface._vptr_DeviceInterface[4])(&local_7f8,device);
      ::vk::checkResult(VVar4,"vkd.deviceWaitIdle(device)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x599);
      local_c48 = (undefined1  [8])&local_c38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c48,"Rendering tests succeeded","");
      pTVar3 = local_d90;
      pWVar2 = local_d98;
      local_d90->m_code = QP_TEST_RESULT_PASS;
      (local_d90->m_description)._M_dataplus._M_p = (pointer)&(local_d90->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d90->m_description,local_c48,
                 (long)&pDStack_c40->_vptr_DeviceInterface + (long)local_c48);
      if (local_c48 != (undefined1  [8])&local_c38) {
        operator_delete((void *)local_c48,CONCAT44(VStack_c34,local_c38) + 1);
      }
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
      ::~vector(&local_d28);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector(&local_d10);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector(&local_cf8);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&local_ce0);
      VVar1.m_internal = local_dc8.m_internal;
      if (local_cc8 != (VkExtent2D)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                  (&DStack_cc0,(VkCommandPool)local_cc8);
      }
      TriangleRenderer::~TriangleRenderer(&local_338);
      if (local_de0.
          super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_de0.
                        super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_de0.
                              super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_de0.
                              super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_dc0._8_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)26>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)26>_> *)(local_dc0 + 0x10),
                   (VkSwapchainKHR)local_dc0._8_8_);
      }
      ::vk::DeviceDriver::~DeviceDriver(&local_7f8);
      if (local_810 != (VkDevice)0x0) {
        (*(code *)pVStack_808)(local_810,local_800);
      }
      if (VVar1.m_internal != 0) {
        (**(code **)(*(long *)aStack_d40 + 0x68))
                  (aStack_d40.m_align,local_d38,VVar1.m_internal,pVStack_d30);
      }
      (*pWVar2->_vptr_Window[1])(pWVar2);
      (**(code **)(*(long *)local_d88 + 8))();
      ::vk::InstanceDriver::~InstanceDriver(&local_9d8.vki);
      if (local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object != (VkInstance)0x0) {
        (*local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance)
                  (local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
                   local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator);
      }
      local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object = (VkInstance_s *)0x0;
      local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance =
           (DestroyInstanceFunc)0x0;
      local_9d8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      if (local_9d8.supportedExtensions.
          super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_9d8.supportedExtensions.
                        super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_9d8.supportedExtensions.
                              super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_9d8.supportedExtensions.
                              super__Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return pTVar3;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"(size_t)imageNdx < swapchainImages.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
             ,0x575);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus basicRenderTest (Context& context, Type wsiType)
{
	const tcu::UVec2				desiredSize					(256, 256);
	const InstanceHelper			instHelper					(context, wsiType);
	const NativeObjects				native						(context, instHelper.supportedExtensions, wsiType, tcu::just(desiredSize));
	const Unique<VkSurfaceKHR>		surface						(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper				devHelper					(context, instHelper.vki, *instHelper.instance, *surface);
	const DeviceInterface&			vkd							= devHelper.vkd;
	const VkDevice					device						= *devHelper.device;
	SimpleAllocator					allocator					(vkd, device, getPhysicalDeviceMemoryProperties(instHelper.vki, devHelper.physicalDevice));
	const VkSwapchainCreateInfoKHR	swapchainInfo				= getBasicSwapchainParameters(wsiType, instHelper.vki, devHelper.physicalDevice, *surface, desiredSize, 2);
	const Unique<VkSwapchainKHR>	swapchain					(createSwapchainKHR(vkd, device, &swapchainInfo));
	const vector<VkImage>			swapchainImages				= getSwapchainImages(vkd, device, *swapchain);

	const TriangleRenderer			renderer					(vkd,
																 device,
																 allocator,
																 context.getBinaryCollection(),
																 swapchainImages,
																 swapchainInfo.imageFormat,
																 tcu::UVec2(swapchainInfo.imageExtent.width, swapchainInfo.imageExtent.height));

	const Unique<VkCommandPool>		commandPool					(createCommandPool(vkd, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, devHelper.queueFamilyIndex));

	const size_t					maxQueuedFrames				= swapchainImages.size()*2;

	// We need to keep hold of fences from vkAcquireNextImageKHR to actually
	// limit number of frames we allow to be queued.
	const vector<FenceSp>			imageReadyFences			(createFences(vkd, device, maxQueuedFrames));

	// We need maxQueuedFrames+1 for imageReadySemaphores pool as we need to pass
	// the semaphore in same time as the fence we use to meter rendering.
	const vector<SemaphoreSp>		imageReadySemaphores		(createSemaphores(vkd, device, maxQueuedFrames+1));

	// For rest we simply need maxQueuedFrames as we will wait for image
	// from frameNdx-maxQueuedFrames to become available to us, guaranteeing that
	// previous uses must have completed.
	const vector<SemaphoreSp>		renderingCompleteSemaphores	(createSemaphores(vkd, device, maxQueuedFrames));
	const vector<CommandBufferSp>	commandBuffers				(allocateCommandBuffers(vkd, device, *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY, maxQueuedFrames));

	try
	{
		const deUint32	numFramesToRender	= 60*10;

		for (deUint32 frameNdx = 0; frameNdx < numFramesToRender; ++frameNdx)
		{
			const VkFence		imageReadyFence		= **imageReadyFences[frameNdx%imageReadyFences.size()];
			const VkSemaphore	imageReadySemaphore	= **imageReadySemaphores[frameNdx%imageReadySemaphores.size()];
			deUint32			imageNdx			= ~0u;

			if (frameNdx >= maxQueuedFrames)
				VK_CHECK(vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max()));

			VK_CHECK(vkd.resetFences(device, 1, &imageReadyFence));

			{
				const VkResult	acquireResult	= vkd.acquireNextImageKHR(device,
																		  *swapchain,
																		  std::numeric_limits<deUint64>::max(),
																		  imageReadySemaphore,
																		  imageReadyFence,
																		  &imageNdx);

				if (acquireResult == VK_SUBOPTIMAL_KHR)
					context.getTestContext().getLog() << TestLog::Message << "Got " << acquireResult << " at frame " << frameNdx << TestLog::EndMessage;
				else
					VK_CHECK(acquireResult);
			}

			TCU_CHECK((size_t)imageNdx < swapchainImages.size());

			{
				const VkSemaphore			renderingCompleteSemaphore	= **renderingCompleteSemaphores[frameNdx%renderingCompleteSemaphores.size()];
				const VkCommandBuffer		commandBuffer				= **commandBuffers[frameNdx%commandBuffers.size()];
				const VkPipelineStageFlags	waitDstStage				= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
				const VkSubmitInfo			submitInfo					=
				{
					VK_STRUCTURE_TYPE_SUBMIT_INFO,
					DE_NULL,
					1u,
					&imageReadySemaphore,
					&waitDstStage,
					1u,
					&commandBuffer,
					1u,
					&renderingCompleteSemaphore
				};
				const VkPresentInfoKHR		presentInfo					=
				{
					VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
					DE_NULL,
					1u,
					&renderingCompleteSemaphore,
					1u,
					&*swapchain,
					&imageNdx,
					(VkResult*)DE_NULL
				};

				renderer.recordFrame(commandBuffer, imageNdx, frameNdx);
				VK_CHECK(vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0));
				VK_CHECK(vkd.queuePresentKHR(devHelper.queue, &presentInfo));
			}
		}

		VK_CHECK(vkd.deviceWaitIdle(device));
	}
	catch (...)
	{
		// Make sure device is idle before destroying resources
		vkd.deviceWaitIdle(device);
		throw;
	}

	return tcu::TestStatus::pass("Rendering tests succeeded");
}